

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall capnp::compiler::Compiler::Impl::~Impl(Impl *this)

{
  std::
  _Rb_tree<capnp::compiler::Declaration::Which,_std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>,_std::_Select1st<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>,_std::less<capnp::compiler::Declaration::Which>,_std::allocator<std::pair<const_capnp::compiler::Declaration::Which,_capnp::compiler::Compiler::Node_*>_>_>
  ::~_Rb_tree(&(this->builtinDeclsByKind)._M_t);
  std::
  _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
  ::~_Rb_tree(&(this->builtinDecls)._M_t);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>,_std::allocator<std::pair<const_unsigned_long,_capnp::schema::Node::SourceInfo::Reader>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->sourceInfoById)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->nodesById)._M_h);
  SchemaLoader::~SchemaLoader(&(this->workspace).bootstrapLoader);
  kj::Arena::~Arena(&(this->workspace).arena);
  MallocMessageBuilder::~MallocMessageBuilder(&(this->workspace).message);
  std::
  _Hashtable<capnp::compiler::Module_*,_std::pair<capnp::compiler::Module_*const,_kj::Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t>_>,_std::allocator<std::pair<capnp::compiler::Module_*const,_kj::Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Module_*>,_std::hash<capnp::compiler::Module_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->modules)._M_h);
  kj::Arena::~Arena(&this->nodeArena);
  return;
}

Assistant:

Compiler::Impl::~Impl() noexcept(false) {}